

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O2

SUNNonlinearSolver SUNNonlinSol_Newton(N_Vector y,SUNContext sunctx)

{
  SUNNonlinearSolver_Ops p_Var1;
  SUNNonlinearSolver p_Var2;
  void *pvVar3;
  undefined8 uVar4;
  
  p_Var2 = (SUNNonlinearSolver)SUNNonlinSolNewEmpty(sunctx);
  p_Var1 = p_Var2->ops;
  p_Var1->gettype = SUNNonlinSolGetType_Newton;
  p_Var1->initialize = SUNNonlinSolInitialize_Newton;
  p_Var1->solve = SUNNonlinSolSolve_Newton;
  p_Var1->free = SUNNonlinSolFree_Newton;
  p_Var1->setsysfn = SUNNonlinSolSetSysFn_Newton;
  p_Var1->setlsetupfn = SUNNonlinSolSetLSetupFn_Newton;
  p_Var1->setlsolvefn = SUNNonlinSolSetLSolveFn_Newton;
  p_Var1->setctestfn = SUNNonlinSolSetConvTestFn_Newton;
  p_Var1->setmaxiters = SUNNonlinSolSetMaxIters_Newton;
  p_Var1->getnumiters = SUNNonlinSolGetNumIters_Newton;
  p_Var1->getcuriter = SUNNonlinSolGetCurIter_Newton;
  p_Var1->getnumconvfails = SUNNonlinSolGetNumConvFails_Newton;
  pvVar3 = calloc(1,0x50);
  p_Var2->content = pvVar3;
  *(undefined4 *)((long)pvVar3 + 0x30) = 3;
  uVar4 = N_VClone(y);
  *(undefined8 *)((long)pvVar3 + 0x20) = uVar4;
  return p_Var2;
}

Assistant:

SUNNonlinearSolver SUNNonlinSol_Newton(N_Vector y, SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNNonlinearSolver NLS;
  SUNNonlinearSolverContent_Newton content;

  /* Check that the supplied N_Vector supports all required operations */
  SUNAssertNull(y->ops->nvclone && y->ops->nvdestroy && y->ops->nvscale &&
                  y->ops->nvlinearsum,
                SUN_ERR_ARG_INCOMPATIBLE);

  /* Create an empty nonlinear linear solver object */
  NLS = SUNNonlinSolNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  NLS->ops->gettype         = SUNNonlinSolGetType_Newton;
  NLS->ops->initialize      = SUNNonlinSolInitialize_Newton;
  NLS->ops->solve           = SUNNonlinSolSolve_Newton;
  NLS->ops->free            = SUNNonlinSolFree_Newton;
  NLS->ops->setsysfn        = SUNNonlinSolSetSysFn_Newton;
  NLS->ops->setlsetupfn     = SUNNonlinSolSetLSetupFn_Newton;
  NLS->ops->setlsolvefn     = SUNNonlinSolSetLSolveFn_Newton;
  NLS->ops->setctestfn      = SUNNonlinSolSetConvTestFn_Newton;
  NLS->ops->setmaxiters     = SUNNonlinSolSetMaxIters_Newton;
  NLS->ops->getnumiters     = SUNNonlinSolGetNumIters_Newton;
  NLS->ops->getcuriter      = SUNNonlinSolGetCurIter_Newton;
  NLS->ops->getnumconvfails = SUNNonlinSolGetNumConvFails_Newton;

  /* Create content */
  content = NULL;
  content = (SUNNonlinearSolverContent_Newton)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Initialize all components of content to 0/NULL */
  memset(content, 0, sizeof(struct _SUNNonlinearSolverContent_Newton));

  /* Attach content */
  NLS->content = content;

  /* Fill general content */
  content->Sys        = NULL;
  content->LSetup     = NULL;
  content->LSolve     = NULL;
  content->CTest      = NULL;
  content->jcur       = SUNFALSE;
  content->curiter    = 0;
  content->maxiters   = 3;
  content->niters     = 0;
  content->nconvfails = 0;
  content->ctest_data = NULL;

  /* Fill allocatable content */
  content->delta = N_VClone(y);
  SUNCheckLastErrNull();

  return (NLS);
}